

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStmComp * __thiscall
CTcParser::parse_compound
          (CTcParser *this,int *err,int skip_lbrace,int need_rbrace,CTPNStmSwitch *enclosing_switch,
          int use_enclosing_scope)

{
  tc_toktyp_t tVar1;
  CTcTokFileDesc *pCVar2;
  long lVar3;
  bool bVar4;
  CTPNStm *pCVar5;
  CTPNStm *pCVar6;
  CTPNStm *pCVar7;
  CTPNStm *first_stm;
  CTPNStmComp *this_00;
  CTPNStm *pCVar8;
  int *siz;
  bool bVar9;
  CTcPrsSymtab *local_58;
  CTcPrsSymtab *local_50;
  
  pCVar2 = G_tok->last_desc_;
  lVar3 = G_tok->last_linenum_;
  siz = err;
  if ((skip_lbrace != 0) && ((G_tok->curtok_).typ_ == TOKT_LBRACE)) {
    CTcTokenizer::next(G_tok);
  }
  if (use_enclosing_scope == 0) {
    local_50 = this->local_symtab_;
    local_58 = this->enclosing_local_symtab_;
    this->enclosing_local_symtab_ = local_50;
  }
  bVar4 = false;
  bVar9 = false;
  pCVar5 = (CTPNStm *)0x0;
  pCVar6 = (CTPNStm *)0x0;
  while (pCVar8 = pCVar6, first_stm = pCVar5, !bVar9) {
    tVar1 = (G_tok->curtok_).typ_;
    bVar9 = true;
    pCVar5 = first_stm;
    pCVar6 = pCVar8;
    if (tVar1 == TOKT_RBRACE) {
      bVar4 = true;
    }
    else if (tVar1 == TOKT_EOF) {
      if (need_rbrace == 0) {
        bVar4 = false;
      }
      else {
        CTcTokenizer::log_error(0x2b22);
      }
    }
    else {
      siz = err;
      pCVar7 = parse_stm(this,err,enclosing_switch,0);
      bVar9 = *err != 0;
      if ((pCVar7 != (CTPNStm *)0x0) && (pCVar5 = pCVar7, pCVar6 = pCVar7, pCVar8 != (CTPNStm *)0x0)
         ) {
        (pCVar8->super_CTPNStmBase).next_stm_ = pCVar7;
        pCVar5 = first_stm;
      }
    }
  }
  if (first_stm == (CTPNStm *)0x0) {
    first_stm = (CTPNStm *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)siz);
    CTPNStmNull::CTPNStmNull((CTPNStmNull *)first_stm);
  }
  this_00 = (CTPNStmComp *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)siz);
  CTPNStmComp::CTPNStmComp(this_00,first_stm,this->local_symtab_);
  (this_00->super_CTPNStmCompBase).super_CTPNStm.super_CTPNStmBase.file_ = pCVar2;
  (this_00->super_CTPNStmCompBase).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar3;
  (this_00->super_CTPNStmCompBase).field_0x40 =
       (this_00->super_CTPNStmCompBase).field_0x40 & 0xfe |
       (this->local_symtab_ != local_50 && use_enclosing_scope == 0);
  if (bVar4) {
    CTcTokenizer::next(G_tok);
  }
  if (use_enclosing_scope == 0) {
    this->local_symtab_ = local_50;
    this->enclosing_local_symtab_ = local_58;
  }
  return this_00;
}

Assistant:

CTPNStmComp *CTcParser::parse_compound(
    int *err, int skip_lbrace, int need_rbrace,
    CTPNStmSwitch *enclosing_switch, int use_enclosing_scope)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* skip the '{' if we're on one and the caller wants us to */
    if (skip_lbrace && G_tok->cur() == TOKT_LBRACE)
        G_tok->next();

    /* enter a scope */
    tcprs_scope_t scope_data;
    if (!use_enclosing_scope)
        enter_scope(&scope_data);

    /* we don't have any statements in our sublist yet */
    CTPNStm *first_stm = 0;
    CTPNStm *last_stm = 0;
    CTPNStm *cur_stm = 0;

    /* presume we won't find the closing brace */
    int skip_rbrace = FALSE;

    /* keep going until we reach the closing '}' */
    for (int done = FALSE ; !done ; )
    {
        /* check what we've found */
        switch (G_tok->cur())
        {
        case TOKT_RBRACE:
            /* it's our closing brace - we're done */
            done = TRUE;
            cur_stm = 0;

            /* note that we must still skip the closing brace */
            skip_rbrace = TRUE;

            /* stop scanning statements */
            break;

        case TOKT_EOF:
            /* 
             *   if we're at end of file, and we don't need a right brace to
             *   end the block, consider this the end of the block 
             */
            if (!need_rbrace)
            {
                done = TRUE;
                cur_stm = 0;
                skip_rbrace = FALSE;
                break;
            }
            else
            {
                /* it's an error */
                G_tok->log_error(TCERR_EOF_IN_CODE);
                cur_stm = 0;
                done = TRUE;
                break;
            }
            break;

        default:
            /* parse a statement */
            cur_stm = parse_stm(err, enclosing_switch, FALSE);

            /* if an error occurred, stop parsing */
            if (*err)
                done = TRUE;
            break;
        }

        /* if we parsed a statement, add it to our list */
        if (cur_stm != 0)
        {
            /* link the statement at the end of our list */
            if (last_stm != 0)
                last_stm->set_next_stm(cur_stm);
            else
                first_stm = cur_stm;
            last_stm = cur_stm;
        }
    }

    /* if there's no statement, make the body a null statement */
    if (first_stm == 0)
        first_stm = new CTPNStmNull();

    /* build the compound statement node */
    CTPNStmComp *comp_stm = new CTPNStmComp(first_stm, local_symtab_);

    /* set some additional information if we created a statement */
    if (comp_stm != 0)
    {
        /* set the statement's line to the start of the compound */
        comp_stm->set_source_pos(file, linenum);

        /* note whether or not we have our own private scope */
        comp_stm->set_has_own_scope(!use_enclosing_scope
                                    && (local_symtab_
                                        != scope_data.local_symtab));
    }

    /* if necessary, skip the closing brace */
    if (skip_rbrace)
        G_tok->next();

    /* leave the local scope */
    if (!use_enclosing_scope)
        leave_scope(&scope_data);

    /* return the compound statement object */
    return comp_stm;
}